

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

int __kmp_api_omp_get_place_num_(void)

{
  int iVar1;
  int iVar2;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  if (__kmp_affin_mask_size == 0) {
    iVar2 = -1;
  }
  else {
    iVar1 = __kmp_get_global_thread_id_reg();
    iVar2 = -1;
    if (-1 < (__kmp_threads[iVar1]->th).th_current_place) {
      iVar2 = (__kmp_threads[iVar1]->th).th_current_place;
    }
  }
  return iVar2;
}

Assistant:

int FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_PLACE_NUM)(void) {
#if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
  return -1;
#else
  int gtid;
  kmp_info_t *thread;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  if (!KMP_AFFINITY_CAPABLE())
    return -1;
  gtid = __kmp_entry_gtid();
  thread = __kmp_thread_from_gtid(gtid);
  if (thread->th.th_current_place < 0)
    return -1;
  return thread->th.th_current_place;
#endif
}